

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::clearEmptySegments(string *unit)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  
  bVar4 = false;
  lVar3 = 0;
LAB_001903a7:
  uVar2 = *(ulong *)((long)&Esegs_abi_cxx11_ + lVar3);
  uVar1 = 0;
  do {
    uVar1 = std::__cxx11::string::find((char *)unit,uVar2,uVar1);
    while( true ) {
      if (uVar1 == 0xffffffffffffffff) {
        lVar3 = lVar3 + 0x20;
        if (lVar3 == 0x80) {
          return bVar4;
        }
        goto LAB_001903a7;
      }
      if ((uVar1 != 0) && ((unit->_M_dataplus)._M_p[uVar1 - 1] == '\\')) break;
      std::__cxx11::string::erase((ulong)unit,uVar1);
      uVar1 = std::__cxx11::string::find
                        ((char *)unit,*(ulong *)((long)&Esegs_abi_cxx11_ + lVar3),uVar1 + 1);
      bVar4 = true;
    }
    uVar1 = uVar1 + 2;
    uVar2 = *(ulong *)((long)&Esegs_abi_cxx11_ + lVar3);
  } while( true );
}

Assistant:

static bool clearEmptySegments(std::string& unit)
{
    bool changed = false;
    for (const auto& seg : Esegs) {
        auto fnd = unit.find(seg);
        while (fnd != std::string::npos) {
            if (fnd > 0 && unit[fnd - 1] == '\\') {
                fnd = unit.find(seg, fnd + 2);
                continue;
            }
            unit.erase(fnd, seg.size());
            changed = true;
            fnd = unit.find(seg, fnd + 1);
        }
    }
    return changed;
}